

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::clear(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  iterator pos;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  local_28;
  
  local_28.m_ = this->elements_;
  InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  ::SearchFrom(&local_28,(local_28.m_)->index_of_first_non_null_);
  if (local_28.node_ != (Node *)0x0) {
    do {
      pos.it_.m_ = local_28.m_;
      pos.it_.node_ = local_28.node_;
      pos.it_.bucket_index_ = local_28.bucket_index_;
      erase((iterator *)&local_28,this,pos);
    } while (local_28.node_ != (Node *)0x0);
  }
  return;
}

Assistant:

void clear() { erase(begin(), end()); }